

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool storeRawNames(XML_Parser parser)

{
  int iVar1;
  int iVar2;
  XML_Char *pXVar3;
  char *temp;
  char *rawNameBuf;
  int nameLen;
  int bufSize;
  TAG *tag;
  XML_Parser parser_local;
  
  _nameLen = parser->m_tagStack;
  while( true ) {
    if (_nameLen == (TAG *)0x0) {
      return '\x01';
    }
    iVar1 = (_nameLen->name).strLen + 1;
    temp = _nameLen->buf + iVar1;
    if (_nameLen->rawName == temp) break;
    iVar2 = iVar1 + _nameLen->rawNameLength;
    if ((long)_nameLen->bufEnd - (long)_nameLen->buf < (long)iVar2) {
      pXVar3 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(_nameLen->buf,(long)iVar2);
      if (pXVar3 == (XML_Char *)0x0) {
        return '\0';
      }
      if ((_nameLen->name).str == _nameLen->buf) {
        (_nameLen->name).str = pXVar3;
      }
      if ((_nameLen->name).localPart != (XML_Char *)0x0) {
        (_nameLen->name).localPart =
             pXVar3 + ((long)(_nameLen->name).localPart - (long)_nameLen->buf);
      }
      _nameLen->buf = pXVar3;
      _nameLen->bufEnd = pXVar3 + iVar2;
      temp = pXVar3 + iVar1;
    }
    memcpy(temp,_nameLen->rawName,(long)_nameLen->rawNameLength);
    _nameLen->rawName = temp;
    _nameLen = _nameLen->parent;
  }
  return '\x01';
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser)
{
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    bufSize = nameLen + ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart = (XML_Char *)temp + (tag->name.localPart -
                                                  (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}